

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void mp::
     WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
               (MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *jw,
               ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
               *condc)

{
  int iVar1;
  FunctionalConstraint *in_RSI;
  char *in_RDI;
  int *in_stack_ffffffffffffff78;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *this;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = FunctionalConstraint::GetResultVar(in_RSI);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff90,in_RDI);
  this = &local_28;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x2395e1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this,in_RDI);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::GetConstraint
            ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *)
             0x239615);
  WriteJSON<mp::LinTerms,mp::AlgConRhs<_1>>
            ((JSONW *)in_RSI,
             (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x239637);
  return;
}

Assistant:

inline void WriteJSON(JW jw,
                      const ConditionalConstraint<Con>& condc) {
  jw["res_var"] = condc.GetResultVar();
  WriteJSON(jw["con"], condc.GetConstraint());
}